

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minReEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,SPxId *id,int nr,bool polish)

{
  uint *puVar1;
  int iVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  Item *pIVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar9;
  int iVar10;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar11;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  cpp_dec_float<100U,_int,_void> *pcVar12;
  pointer pnVar13;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined7 in_register_00000089;
  long lVar14;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar15;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar16;
  cpp_dec_float<100U,_int,_void> *v_00;
  uint uVar17;
  fpclass_type fVar18;
  int32_t iVar19;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c0;
  cpp_dec_float<100U,_int,_void> local_1b8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_160;
  undefined1 local_158 [88];
  int local_100;
  undefined4 local_fc;
  cpp_dec_float<100U,_int,_void> local_f8;
  cpp_dec_float<100U,_int,_void> *local_a0;
  cpp_dec_float<100U,_int,_void> local_98;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_48;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_40;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 0x10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems[6] = 0;
  local_1b8.data._M_elems[7] = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.data._M_elems[10] = 0;
  local_1b8.data._M_elems[0xb] = 0;
  local_1b8.data._M_elems[0xc] = 0;
  local_1b8.data._M_elems[0xd] = 0;
  local_1b8.data._M_elems._56_5_ = 0;
  local_1b8.data._M_elems[0xf]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  local_98.fpclass = cpp_dec_float_finite;
  local_98.prec_elem = 0x10;
  local_98.data._M_elems[0] = 0;
  local_98.data._M_elems[1] = 0;
  local_98.data._M_elems[2] = 0;
  local_98.data._M_elems[3] = 0;
  local_98.data._M_elems[4] = 0;
  local_98.data._M_elems[5] = 0;
  local_98.data._M_elems[6] = 0;
  local_98.data._M_elems[7] = 0;
  local_98.data._M_elems[8] = 0;
  local_98.data._M_elems[9] = 0;
  local_98.data._M_elems[10] = 0;
  local_98.data._M_elems[0xb] = 0;
  local_98.data._M_elems[0xc] = 0;
  local_98.data._M_elems[0xd] = 0;
  local_98.data._M_elems._56_5_ = 0;
  local_98.data._M_elems[0xf]._1_3_ = 0;
  local_98.exp = 0;
  local_98.neg = false;
  pSVar11 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  pUVar15 = pSVar11->thePvec;
  this_00 = &pUVar15->thedelta;
  pUVar3 = pSVar11->theCoPvec;
  iVar10 = (id->super_DataKey).info * pSVar11->theRep;
  local_a0 = &maxabs->m_backend;
  if (iVar10 < 0) {
    lVar14 = (long)nr;
    if (0 < pSVar11->theRep *
            ((pSVar11->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[lVar14]) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clearIdx(&pUVar3->thedelta,nr);
      return true;
    }
    local_1c0 = pSVar11->theCoUbound;
    local_160 = pSVar11->theCoLbound;
    pnVar13 = (pUVar3->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_1b8.data._M_elems._0_8_ = *(undefined8 *)&pnVar13[lVar14].m_backend;
    local_1b8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar13[lVar14].m_backend + 8);
    local_1b8.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar13 + lVar14) + 0x10);
    local_1b8.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar13 + lVar14) + 0x18);
    local_1b8.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar13 + lVar14) + 0x20);
    local_1b8.data._M_elems._40_8_ = *(undefined8 *)((long)(pnVar13 + lVar14) + 0x28);
    local_1b8.data._M_elems._48_8_ = *(undefined8 *)((long)(pnVar13 + lVar14) + 0x30);
    uVar6 = *(undefined8 *)((long)(pnVar13 + lVar14) + 0x38);
    local_1b8.data._M_elems._56_5_ = SUB85(uVar6,0);
    local_1b8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_1b8.exp = *(int *)((long)(pnVar13 + lVar14) + 0x40);
    local_1b8.neg = *(bool *)((long)(pnVar13 + lVar14) + 0x44);
    local_1b8._72_8_ = *(undefined8 *)((long)(pnVar13 + lVar14) + 0x48);
    pnVar5 = (pUVar3->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_98.exp = pnVar5[lVar14].m_backend.exp;
    local_98.neg = pnVar5[lVar14].m_backend.neg;
    local_98.fpclass = pnVar5[lVar14].m_backend.fpclass;
    local_98.prec_elem = pnVar5[lVar14].m_backend.prec_elem;
    local_98.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[lVar14].m_backend.data;
    local_98.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar5[lVar14].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[lVar14].m_backend.data + 0x10);
    local_98.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[lVar14].m_backend.data + 0x20);
    local_98.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_98.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar5[lVar14].m_backend.data + 0x30);
    local_98.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    local_98.data._M_elems._56_5_ = SUB85(uVar6,0);
    local_98.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    pVVar9 = local_1c0;
    local_158._80_8_ = lVar14;
    if (local_98.fpclass == cpp_dec_float_NaN) {
LAB_00486289:
      pcVar12 = &(pVVar9->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar14].m_backend;
      local_158._72_4_ = cpp_dec_float_finite;
      local_158._76_4_ = 0x10;
      local_158._0_4_ = 0;
      local_158._4_4_ = 0;
      local_158._8_4_ = 0;
      local_158._12_4_ = 0;
      local_158._16_4_ = 0;
      local_158._20_4_ = 0;
      local_158._24_4_ = 0;
      local_158._28_4_ = 0;
      local_158._32_4_ = 0;
      local_158._36_4_ = 0;
      local_158._40_4_ = 0;
      local_158._44_4_ = 0;
      local_158._48_4_ = 0;
      local_158._52_4_ = 0;
      local_158._56_5_ = 0;
      local_158._61_3_ = 0;
      local_158._64_4_ = 0;
      local_158[0x44] = false;
      if ((cpp_dec_float<100U,_int,_void> *)local_158 == &pnVar13[lVar14].m_backend) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  ((cpp_dec_float<100U,_int,_void> *)local_158,pcVar12);
        if (local_158._0_4_ != 0 || local_158._72_4_ != cpp_dec_float_finite) goto LAB_00486346;
      }
      else {
        if ((cpp_dec_float<100U,_int,_void> *)local_158 != pcVar12) {
          local_158._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
          local_158._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
          local_158._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          local_158._24_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          local_158._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_158._40_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 10);
          local_158._48_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 0xc);
          uVar6 = *(undefined8 *)((pcVar12->data)._M_elems + 0xe);
          local_158._56_5_ = (undefined5)uVar6;
          local_158._61_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_158._64_4_ = pcVar12->exp;
          local_158[0x44] = pcVar12->neg;
          local_158._72_4_ = pcVar12->fpclass;
          local_158._76_4_ = pcVar12->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  ((cpp_dec_float<100U,_int,_void> *)local_158,&pnVar13[lVar14].m_backend);
      }
    }
    else {
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 0x10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems[6] = 0;
      local_f8.data._M_elems[7] = 0;
      local_f8.data._M_elems[8] = 0;
      local_f8.data._M_elems[9] = 0;
      local_f8.data._M_elems[10] = 0;
      local_f8.data._M_elems[0xb] = 0;
      local_f8.data._M_elems[0xc] = 0;
      local_f8.data._M_elems[0xd] = 0;
      local_f8.data._M_elems[0xe] = 0;
      local_f8.data._M_elems[0xf] = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_f8,0.0);
      iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_98,&local_f8);
      pSVar11 = (this->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
      if (iVar10 < 1) {
        pVVar9 = pSVar11->theCoUbound;
        pnVar13 = (pUVar3->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00486289;
      }
      pcVar12 = &(pSVar11->theCoLbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar14].m_backend;
      v_00 = &(pUVar3->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar14].m_backend;
      local_158._72_4_ = cpp_dec_float_finite;
      local_158._76_4_ = 0x10;
      local_158._0_4_ = 0;
      local_158._4_4_ = 0;
      local_158._8_4_ = 0;
      local_158._12_4_ = 0;
      local_158._16_4_ = 0;
      local_158._20_4_ = 0;
      local_158._24_4_ = 0;
      local_158._28_4_ = 0;
      local_158._32_4_ = 0;
      local_158._36_4_ = 0;
      local_158._40_4_ = 0;
      local_158._44_4_ = 0;
      local_158._48_4_ = 0;
      local_158._52_4_ = 0;
      local_158._56_5_ = 0;
      local_158._61_3_ = 0;
      local_158._64_4_ = 0;
      local_158[0x44] = false;
      if ((cpp_dec_float<100U,_int,_void> *)local_158 == v_00) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  ((cpp_dec_float<100U,_int,_void> *)local_158,pcVar12);
        if (local_158._0_4_ == 0 && local_158._72_4_ == cpp_dec_float_finite) goto LAB_00486361;
LAB_00486346:
        local_158[0x44] = local_158[0x44] ^ 1;
      }
      else {
        if ((cpp_dec_float<100U,_int,_void> *)local_158 != pcVar12) {
          local_158._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
          local_158._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
          local_158._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          local_158._24_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          local_158._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_158._40_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 10);
          local_158._48_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 0xc);
          uVar6 = *(undefined8 *)((pcVar12->data)._M_elems + 0xe);
          local_158._56_5_ = (undefined5)uVar6;
          local_158._61_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_158._64_4_ = pcVar12->exp;
          local_158[0x44] = pcVar12->neg;
          local_158._72_4_ = pcVar12->fpclass;
          local_158._76_4_ = pcVar12->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  ((cpp_dec_float<100U,_int,_void> *)local_158,v_00);
      }
    }
LAB_00486361:
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 0x10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.data._M_elems[10] = 0;
    local_f8.data._M_elems[0xb] = 0;
    local_f8.data._M_elems[0xc] = 0;
    local_f8.data._M_elems[0xd] = 0;
    local_f8.data._M_elems[0xe] = 0;
    local_f8.data._M_elems[0xf] = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_f8,(cpp_dec_float<100U,_int,_void> *)local_158,&local_98);
    goto LAB_004863b5;
  }
  if (iVar10 == 0) {
    return true;
  }
  local_1c0 = pSVar11->theUbound;
  local_160 = pSVar11->theLbound;
  pIVar4 = (pSVar11->thevectors->set).theitem;
  local_158._80_8_ = SEXT48(nr);
  iVar10 = (pSVar11->thevectors->set).thekey[local_158._80_8_].idx;
  local_f8.fpclass = cpp_dec_float_finite;
  local_f8.prec_elem = 0x10;
  local_f8.data._M_elems[0] = 0;
  local_f8.data._M_elems[1] = 0;
  local_f8.data._M_elems[2] = 0;
  local_f8.data._M_elems[3] = 0;
  local_f8.data._M_elems[4] = 0;
  local_f8.data._M_elems[5] = 0;
  local_f8.data._M_elems[6] = 0;
  local_f8.data._M_elems[7] = 0;
  local_f8.data._M_elems[8] = 0;
  local_f8.data._M_elems[9] = 0;
  local_f8.data._M_elems[10] = 0;
  local_f8.data._M_elems[0xb] = 0;
  local_f8.data._M_elems[0xc] = 0;
  local_f8.data._M_elems[0xd] = 0;
  local_f8.data._M_elems[0xe] = 0;
  local_f8.data._M_elems[0xf] = 0;
  local_f8.exp = 0;
  local_f8.neg = false;
  iVar2 = pIVar4[iVar10].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  if (iVar2 < 1) {
    fVar18 = cpp_dec_float_finite;
    iVar19 = 0x10;
  }
  else {
    pNVar16 = pIVar4[iVar10].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    uVar17 = iVar2 + 1;
    local_100 = nr;
    local_fc = (int)CONCAT71(in_register_00000089,polish);
    local_48 = this_00;
    local_40 = pUVar15;
    local_38 = this;
    do {
      pNVar8 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)((pUVar3->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + pNVar16->idx);
      local_158._72_4_ = cpp_dec_float_finite;
      local_158._76_4_ = 0x10;
      local_158._0_4_ = 0;
      local_158._4_4_ = 0;
      local_158._8_4_ = 0;
      local_158._12_4_ = 0;
      local_158._16_4_ = 0;
      local_158._20_4_ = 0;
      local_158._24_4_ = 0;
      local_158._28_4_ = 0;
      local_158._32_4_ = 0;
      local_158._36_4_ = 0;
      local_158._40_4_ = 0;
      local_158._44_4_ = 0;
      local_158._48_4_ = 0;
      local_158._52_4_ = 0;
      local_158._56_5_ = 0;
      local_158._61_3_ = 0;
      local_158._64_4_ = 0;
      local_158[0x44] = false;
      v = pNVar16;
      if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)local_158 != pNVar8) &&
         (v = pNVar8,
         pNVar16 !=
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)local_158)) {
        local_158._0_8_ = *(undefined8 *)(pNVar16->val).m_backend.data._M_elems;
        local_158._8_8_ = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 2);
        local_158._16_8_ = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 4);
        local_158._24_8_ = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 6);
        local_158._32_8_ = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 8);
        local_158._40_8_ = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 10);
        local_158._48_8_ = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 0xc);
        uVar6 = *(undefined8 *)((pNVar16->val).m_backend.data._M_elems + 0xe);
        local_158._56_5_ = (undefined5)uVar6;
        local_158._61_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_158._64_4_ = (pNVar16->val).m_backend.exp;
        local_158[0x44] = (pNVar16->val).m_backend.neg;
        local_158._72_4_ = (pNVar16->val).m_backend.fpclass;
        local_158._76_4_ = (pNVar16->val).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                ((cpp_dec_float<100U,_int,_void> *)local_158,(cpp_dec_float<100U,_int,_void> *)v);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_f8,(cpp_dec_float<100U,_int,_void> *)local_158);
      pNVar16 = pNVar16 + 1;
      uVar17 = uVar17 - 1;
    } while (1 < uVar17);
    fVar18 = local_f8.fpclass;
    iVar19 = local_f8.prec_elem;
    polish = SUB41(local_fc,0);
    this_00 = local_48;
    pUVar15 = local_40;
    this = local_38;
    nr = local_100;
  }
  uVar6 = local_158._80_8_;
  local_158._48_4_ = local_f8.data._M_elems[0xc];
  local_158._52_4_ = local_f8.data._M_elems[0xd];
  local_158._56_5_ = (undefined5)CONCAT44(local_f8.data._M_elems[0xf],local_f8.data._M_elems[0xe]);
  local_158._61_3_ = (undefined3)(local_f8.data._M_elems[0xf] >> 8);
  local_158._32_4_ = local_f8.data._M_elems[8];
  local_158._36_4_ = local_f8.data._M_elems[9];
  local_158._40_4_ = local_f8.data._M_elems[10];
  local_158._44_4_ = local_f8.data._M_elems[0xb];
  local_158._16_4_ = local_f8.data._M_elems[4];
  local_158._20_4_ = local_f8.data._M_elems[5];
  local_158._24_4_ = local_f8.data._M_elems[6];
  local_158._28_4_ = local_f8.data._M_elems[7];
  local_158._0_4_ = local_f8.data._M_elems[0];
  local_158._4_4_ = local_f8.data._M_elems[1];
  local_158._8_4_ = local_f8.data._M_elems[2];
  local_158._12_4_ = local_f8.data._M_elems[3];
  pnVar13 = (pUVar15->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x30) = local_f8.data._M_elems._48_8_;
  *(ulong *)((long)(pnVar13 + local_158._80_8_) + 0x38) =
       CONCAT44(local_f8.data._M_elems[0xf],local_f8.data._M_elems[0xe]);
  *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x20) = local_f8.data._M_elems._32_8_;
  *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x28) = local_f8.data._M_elems._40_8_;
  *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x10) = local_f8.data._M_elems._16_8_;
  *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x18) = local_f8.data._M_elems._24_8_;
  *(undefined8 *)&pnVar13[local_158._80_8_].m_backend = local_f8.data._M_elems._0_8_;
  *(undefined8 *)((long)&pnVar13[local_158._80_8_].m_backend + 8) = local_f8.data._M_elems._8_8_;
  *(int *)((long)(pnVar13 + local_158._80_8_) + 0x40) = local_f8.exp;
  *(bool *)((long)(pnVar13 + local_158._80_8_) + 0x44) = local_f8.neg;
  *(ulong *)((long)(pnVar13 + local_158._80_8_) + 0x48) = CONCAT44(iVar19,fVar18);
  pSVar11 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  if (0 < pSVar11->theRep *
          ((pSVar11->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[local_158._80_8_]) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clearIdx(this_00,nr);
    return true;
  }
  pnVar13 = (pUVar15->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1b8.data._M_elems._0_8_ = *(undefined8 *)&pnVar13[local_158._80_8_].m_backend;
  local_1b8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar13[local_158._80_8_].m_backend + 8);
  local_1b8.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x10);
  local_1b8.data._M_elems._24_8_ = *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x18);
  local_1b8.data._M_elems._32_8_ = *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x20);
  local_1b8.data._M_elems._40_8_ = *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x28);
  local_1b8.data._M_elems._48_8_ = *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x30);
  uVar7 = *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x38);
  local_1b8.data._M_elems._56_5_ = SUB85(uVar7,0);
  local_1b8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_1b8.exp = *(int *)((long)(pnVar13 + local_158._80_8_) + 0x40);
  local_1b8.neg = *(bool *)((long)(pnVar13 + local_158._80_8_) + 0x44);
  local_1b8._72_8_ = *(undefined8 *)((long)(pnVar13 + local_158._80_8_) + 0x48);
  pnVar5 = (pUVar15->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98.exp = pnVar5[local_158._80_8_].m_backend.exp;
  local_98.neg = pnVar5[local_158._80_8_].m_backend.neg;
  local_98.fpclass = pnVar5[local_158._80_8_].m_backend.fpclass;
  local_98.prec_elem = pnVar5[local_158._80_8_].m_backend.prec_elem;
  local_98.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[local_158._80_8_].m_backend.data;
  local_98.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar5[local_158._80_8_].m_backend.data + 8)
  ;
  puVar1 = (uint *)((long)&pnVar5[local_158._80_8_].m_backend.data + 0x10);
  local_98.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_98.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar5[local_158._80_8_].m_backend.data + 0x20);
  local_98.data._M_elems._32_8_ = *(undefined8 *)puVar1;
  local_98.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar5[local_158._80_8_].m_backend.data + 0x30);
  local_98.data._M_elems._48_8_ = *(undefined8 *)puVar1;
  uVar7 = *(undefined8 *)(puVar1 + 2);
  local_98.data._M_elems._56_5_ = SUB85(uVar7,0);
  local_98.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  if (local_98.fpclass == cpp_dec_float_NaN) {
LAB_00486180:
    pVVar9 = pSVar11->theUbound;
  }
  else {
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 0x10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.data._M_elems[10] = 0;
    local_f8.data._M_elems[0xb] = 0;
    local_f8.data._M_elems[0xc] = 0;
    local_f8.data._M_elems[0xd] = 0;
    local_f8.data._M_elems[0xe] = 0;
    local_f8.data._M_elems[0xf] = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_f8,0.0);
    iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_98,&local_f8);
    pSVar11 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver;
    pnVar13 = (pUVar15->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (iVar10 < 1) goto LAB_00486180;
    pVVar9 = pSVar11->theLbound;
  }
  pcVar12 = &(pVVar9->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6].m_backend;
  local_158._72_4_ = cpp_dec_float_finite;
  local_158._76_4_ = 0x10;
  local_158._0_4_ = 0;
  local_158._4_4_ = 0;
  local_158._8_4_ = 0;
  local_158._12_4_ = 0;
  local_158._16_4_ = 0;
  local_158._20_4_ = 0;
  local_158._24_4_ = 0;
  local_158._28_4_ = 0;
  local_158._32_4_ = 0;
  local_158._36_4_ = 0;
  local_158._40_4_ = 0;
  local_158._44_4_ = 0;
  local_158._48_4_ = 0;
  local_158._52_4_ = 0;
  local_158._56_5_ = 0;
  local_158._61_3_ = 0;
  local_158._64_4_ = 0;
  local_158[0x44] = false;
  if ((cpp_dec_float<100U,_int,_void> *)local_158 == &pnVar13[uVar6].m_backend) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              ((cpp_dec_float<100U,_int,_void> *)local_158,pcVar12);
    if (local_158._0_4_ != 0 || local_158._72_4_ != cpp_dec_float_finite) {
      local_158[0x44] = local_158[0x44] ^ 1;
    }
  }
  else {
    if ((cpp_dec_float<100U,_int,_void> *)local_158 != pcVar12) {
      local_158._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
      local_158._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
      local_158._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
      local_158._24_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 6);
      local_158._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
      local_158._40_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 10);
      local_158._48_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 0xc);
      uVar7 = *(undefined8 *)((pcVar12->data)._M_elems + 0xe);
      local_158._56_5_ = (undefined5)uVar7;
      local_158._61_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_158._64_4_ = pcVar12->exp;
      local_158[0x44] = pcVar12->neg;
      local_158._72_4_ = pcVar12->fpclass;
      local_158._76_4_ = pcVar12->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              ((cpp_dec_float<100U,_int,_void> *)local_158,&pnVar13[uVar6].m_backend);
  }
  local_f8.fpclass = cpp_dec_float_finite;
  local_f8.prec_elem = 0x10;
  local_f8.data._M_elems[0] = 0;
  local_f8.data._M_elems[1] = 0;
  local_f8.data._M_elems[2] = 0;
  local_f8.data._M_elems[3] = 0;
  local_f8.data._M_elems[4] = 0;
  local_f8.data._M_elems[5] = 0;
  local_f8.data._M_elems[6] = 0;
  local_f8.data._M_elems[7] = 0;
  local_f8.data._M_elems[8] = 0;
  local_f8.data._M_elems[9] = 0;
  local_f8.data._M_elems[10] = 0;
  local_f8.data._M_elems[0xb] = 0;
  local_f8.data._M_elems[0xc] = 0;
  local_f8.data._M_elems[0xd] = 0;
  local_f8.data._M_elems[0xe] = 0;
  local_f8.data._M_elems[0xf] = 0;
  local_f8.exp = 0;
  local_f8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_f8,(cpp_dec_float<100U,_int,_void> *)local_158,&local_98);
LAB_004863b5:
  uVar6 = local_158._80_8_;
  (sel->m_backend).data._M_elems[0xc] = local_f8.data._M_elems[0xc];
  (sel->m_backend).data._M_elems[0xd] = local_f8.data._M_elems[0xd];
  (sel->m_backend).data._M_elems[0xe] = local_f8.data._M_elems[0xe];
  (sel->m_backend).data._M_elems[0xf] = local_f8.data._M_elems[0xf];
  (sel->m_backend).data._M_elems[8] = local_f8.data._M_elems[8];
  (sel->m_backend).data._M_elems[9] = local_f8.data._M_elems[9];
  (sel->m_backend).data._M_elems[10] = local_f8.data._M_elems[10];
  (sel->m_backend).data._M_elems[0xb] = local_f8.data._M_elems[0xb];
  (sel->m_backend).data._M_elems[4] = local_f8.data._M_elems[4];
  (sel->m_backend).data._M_elems[5] = local_f8.data._M_elems[5];
  (sel->m_backend).data._M_elems[6] = local_f8.data._M_elems[6];
  (sel->m_backend).data._M_elems[7] = local_f8.data._M_elems[7];
  (sel->m_backend).data._M_elems[0] = local_f8.data._M_elems[0];
  (sel->m_backend).data._M_elems[1] = local_f8.data._M_elems[1];
  (sel->m_backend).data._M_elems[2] = local_f8.data._M_elems[2];
  (sel->m_backend).data._M_elems[3] = local_f8.data._M_elems[3];
  (sel->m_backend).exp = local_f8.exp;
  (sel->m_backend).neg = local_f8.neg;
  (sel->m_backend).fpclass = local_f8.fpclass;
  (sel->m_backend).prec_elem = local_f8.prec_elem;
  pnVar13 = (local_1c0->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((pnVar13[local_158._80_8_].m_backend.fpclass == cpp_dec_float_NaN) ||
      (pnVar5 = (local_160->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pnVar5[local_158._80_8_].m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&pnVar13[local_158._80_8_].m_backend,&pnVar5[local_158._80_8_].m_backend),
     iVar10 != 0)) {
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 0x10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.data._M_elems[10] = 0;
    local_f8.data._M_elems[0xb] = 0;
    local_f8.data._M_elems[0xc] = 0;
    local_f8.data._M_elems[0xd] = 0;
    local_f8.data._M_elems[0xe] = 0;
    local_f8.data._M_elems[0xf] = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_f8,&(this->fastDelta).m_backend,local_a0);
    if ((((sel->m_backend).fpclass != cpp_dec_float_NaN) && (local_f8.fpclass != cpp_dec_float_NaN))
       && ((iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&sel->m_backend,&local_f8), 0 < iVar10 &&
           (boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)sel,0.0), polish == false)))) {
      if (local_98.fpclass != cpp_dec_float_NaN) {
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 0x10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems[6] = 0;
        local_f8.data._M_elems[7] = 0;
        local_f8.data._M_elems[8] = 0;
        local_f8.data._M_elems[9] = 0;
        local_f8.data._M_elems[10] = 0;
        local_f8.data._M_elems[0xb] = 0;
        local_f8.data._M_elems[0xc] = 0;
        local_f8.data._M_elems[0xd] = 0;
        local_f8.data._M_elems[0xe] = 0;
        local_f8.data._M_elems[0xf] = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_f8,0.0);
        iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_98,&local_f8);
        if (iVar10 < 0) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(local_1c0->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6].m_backend);
          pnVar13 = (local_1c0->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar13[uVar6].m_backend.data = local_1b8.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar13[uVar6].m_backend.data + 8) = local_1b8.data._M_elems._8_8_;
          puVar1 = (uint *)((long)&pnVar13[uVar6].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = local_1b8.data._M_elems._16_8_;
          *(undefined8 *)(puVar1 + 2) = local_1b8.data._M_elems._24_8_;
          puVar1 = (uint *)((long)&pnVar13[uVar6].m_backend.data + 0x20);
          *(undefined8 *)puVar1 = local_1b8.data._M_elems._32_8_;
          *(undefined8 *)(puVar1 + 2) = local_1b8.data._M_elems._40_8_;
          puVar1 = (uint *)((long)&pnVar13[uVar6].m_backend.data + 0x30);
          *(undefined8 *)puVar1 = local_1b8.data._M_elems._48_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_);
          pnVar13[uVar6].m_backend.exp = local_1b8.exp;
          pnVar13[uVar6].m_backend.neg = local_1b8.neg;
          pnVar13[uVar6].m_backend.fpclass = local_1b8.fpclass;
          pnVar13[uVar6].m_backend.prec_elem = local_1b8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(local_1c0->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6].m_backend);
          return false;
        }
      }
      pVVar9 = local_160;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(local_160->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar6].m_backend);
      pnVar13 = (pVVar9->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)&pnVar13[uVar6].m_backend.data = local_1b8.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar13[uVar6].m_backend.data + 8) = local_1b8.data._M_elems._8_8_;
      puVar1 = (uint *)((long)&pnVar13[uVar6].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_1b8.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_1b8.data._M_elems._24_8_;
      puVar1 = (uint *)((long)&pnVar13[uVar6].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = local_1b8.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_1b8.data._M_elems._40_8_;
      puVar1 = (uint *)((long)&pnVar13[uVar6].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = local_1b8.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_);
      pnVar13[uVar6].m_backend.exp = local_1b8.exp;
      pnVar13[uVar6].m_backend.neg = local_1b8.neg;
      pnVar13[uVar6].m_backend.fpclass = local_1b8.fpclass;
      pnVar13[uVar6].m_backend.prec_elem = local_1b8.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(pVVar9->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar6].m_backend);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)sel,0.0);
    pVVar9 = local_160;
    if (polish == false) {
      if (((local_1b8.fpclass == cpp_dec_float_NaN) ||
          (pnVar13 = (local_1c0->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          pnVar13[uVar6].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_1b8,&pnVar13[uVar6].m_backend), iVar10 < 1)) {
        pcVar12 = &(pVVar9->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6].m_backend;
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 0x10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems[6] = 0;
        local_f8.data._M_elems[7] = 0;
        local_f8.data._M_elems[8] = 0;
        local_f8.data._M_elems[9] = 0;
        local_f8.data._M_elems[10] = 0;
        local_f8.data._M_elems[0xb] = 0;
        local_f8.data._M_elems[0xc] = 0;
        local_f8.data._M_elems[0xd] = 0;
        local_f8.data._M_elems[0xe] = 0;
        local_f8.data._M_elems[0xf] = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        if (&local_f8 != pcVar12) {
          local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
          local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
          local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          local_f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          local_f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 10);
          local_f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 0xc);
          uVar7 = *(undefined8 *)((pcVar12->data)._M_elems + 0xe);
          local_f8.data._M_elems[0xe] = (uint)uVar7;
          local_f8.data._M_elems[0xf] = (uint)((ulong)uVar7 >> 0x20);
          local_f8.exp = pcVar12->exp;
          local_f8.neg = pcVar12->neg;
          local_f8.fpclass = pcVar12->fpclass;
          local_f8.prec_elem = pcVar12->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_f8,&local_1b8);
        pSVar11 = (this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver;
      }
      else {
        pcVar12 = &(local_1c0->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6].m_backend;
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 0x10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems[6] = 0;
        local_f8.data._M_elems[7] = 0;
        local_f8.data._M_elems[8] = 0;
        local_f8.data._M_elems[9] = 0;
        local_f8.data._M_elems[10] = 0;
        local_f8.data._M_elems[0xb] = 0;
        local_f8.data._M_elems[0xc] = 0;
        local_f8.data._M_elems[0xd] = 0;
        local_f8.data._M_elems[0xe] = 0;
        local_f8.data._M_elems[0xf] = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        if (&local_f8 == pcVar12) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_f8,&local_1b8);
          if (local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) {
            local_f8.neg = (bool)(local_f8.neg ^ 1);
          }
        }
        else {
          local_f8.data._M_elems[0xc] = local_1b8.data._M_elems[0xc];
          local_f8.data._M_elems[0xd] = local_1b8.data._M_elems[0xd];
          local_f8.data._M_elems[0xe] = local_1b8.data._M_elems[0xe];
          local_f8.data._M_elems[0xf] =
               (uint)(CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_) >>
                     0x20);
          local_f8.data._M_elems[8] = local_1b8.data._M_elems[8];
          local_f8.data._M_elems[9] = local_1b8.data._M_elems[9];
          local_f8.data._M_elems[10] = local_1b8.data._M_elems[10];
          local_f8.data._M_elems[0xb] = local_1b8.data._M_elems[0xb];
          local_f8.data._M_elems[4] = local_1b8.data._M_elems[4];
          local_f8.data._M_elems[5] = local_1b8.data._M_elems[5];
          local_f8.data._M_elems[6] = local_1b8.data._M_elems[6];
          local_f8.data._M_elems[7] = local_1b8.data._M_elems[7];
          local_f8.data._M_elems[0] = local_1b8.data._M_elems[0];
          local_f8.data._M_elems[1] = local_1b8.data._M_elems[1];
          local_f8.data._M_elems[2] = local_1b8.data._M_elems[2];
          local_f8.data._M_elems[3] = local_1b8.data._M_elems[3];
          local_f8.exp = local_1b8.exp;
          local_f8.neg = local_1b8.neg;
          local_f8.fpclass = local_1b8.fpclass;
          local_f8.prec_elem = local_1b8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_f8,pcVar12);
        }
        pSVar11 = (this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&(pSVar11->theShift).m_backend,&local_f8);
      pnVar13 = (pVVar9->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&pnVar13[uVar6].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = local_1b8.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_);
      puVar1 = (uint *)((long)&pnVar13[uVar6].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = local_1b8.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_1b8.data._M_elems._40_8_;
      puVar1 = (uint *)((long)&pnVar13[uVar6].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_1b8.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_1b8.data._M_elems._24_8_;
      *(undefined8 *)&pnVar13[uVar6].m_backend.data = local_1b8.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar13[uVar6].m_backend.data + 8) = local_1b8.data._M_elems._8_8_;
      pnVar13[uVar6].m_backend.exp = local_1b8.exp;
      pnVar13[uVar6].m_backend.neg = local_1b8.neg;
      pnVar13[uVar6].m_backend.fpclass = local_1b8.fpclass;
      pnVar13[uVar6].m_backend.prec_elem = local_1b8.prec_elem;
      pnVar5 = (local_1c0->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&pnVar5[uVar6].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = local_1b8.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_);
      puVar1 = (uint *)((long)&pnVar5[uVar6].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = local_1b8.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_1b8.data._M_elems._40_8_;
      puVar1 = (uint *)((long)&pnVar5[uVar6].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_1b8.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_1b8.data._M_elems._24_8_;
      *(undefined8 *)&pnVar5[uVar6].m_backend.data = local_1b8.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar5[uVar6].m_backend.data + 8) = local_1b8.data._M_elems._8_8_;
      pnVar5[uVar6].m_backend.exp = pnVar13[uVar6].m_backend.exp;
      pnVar5[uVar6].m_backend.neg = pnVar13[uVar6].m_backend.neg;
      iVar19 = pnVar13[uVar6].m_backend.prec_elem;
      pnVar5[uVar6].m_backend.fpclass = pnVar13[uVar6].m_backend.fpclass;
      pnVar5[uVar6].m_backend.prec_elem = iVar19;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::minReEnter(
   R& sel,
   R maxabs,
   const SPxId& id,
   int nr,
   bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d > 0.0)
         sel = (this->thesolver->lcBound()[nr] - cvec[nr]) / d;
      else
         sel = (this->thesolver->ucBound()[nr] - cvec[nr]) / d;
   }

   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d > 0.0)
         sel = (this->thesolver->lpBound()[nr] - pvec[nr]) / d;
      else
         sel = (this->thesolver->upBound()[nr] - pvec[nr]) / d;
   }

   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d < 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}